

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  byte *pbVar14;
  ulong *puVar15;
  ulong uVar16;
  HUF_CStream_t bitC;
  HUF_CStream_t local_58;
  
  if (7 < dstSize) {
    local_58.bitPos[0] = 0;
    local_58.bitPos[1] = 0;
    local_58.bitContainer[0] = 0;
    local_58.bitContainer[1] = 0;
    local_58.endPtr = (BYTE *)((long)dst + (dstSize - 8));
    if (dstSize == 8) {
      sVar4 = 0;
    }
    else {
      uVar10 = (uint)*CTable & 0xff;
      uVar5 = (uint)srcSize;
      if (uVar10 < 0xc && ((*CTable & 0xff) * srcSize >> 3) + 8 <= dstSize) {
        local_58.ptr = (BYTE *)dst;
        switch(uVar10) {
        case 7:
          uVar10 = uVar5 + 7;
          if (-1 < (int)uVar5) {
            uVar10 = uVar5;
          }
          iVar11 = uVar5 - (uVar10 & 0xfffffff8);
          if (0 < iVar11) {
            local_58.bitContainer[0] = 0;
            uVar8 = 0;
            pbVar14 = (byte *)((long)(int)uVar5 + (long)src);
            iVar11 = iVar11 + 1;
            do {
              pbVar14 = pbVar14 + -1;
              uVar9 = CTable[(ulong)*pbVar14 + 1];
              uVar8 = uVar8 + uVar9;
              local_58.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              iVar11 = iVar11 + -1;
            } while (1 < iVar11);
            local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
            local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)dst);
          }
          uVar5 = (uint)srcSize;
          if ((srcSize & 0xf) != 0) {
            lVar6 = (long)(int)uVar5;
            lVar12 = 7;
            do {
              uVar8 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar6 + -8) + 1];
              local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar8;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar5 = uVar5 - 8;
            uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + -8) + 1];
            uVar9 = local_58.bitPos[0] + uVar8;
            local_58.bitContainer[0] =
                 uVar8 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar8 & 0x3f);
            local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f)
            ;
            local_58.ptr = (BYTE *)(((uVar9 & 0xff) >> 3) + (long)local_58.ptr);
          }
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
            lVar6 = (long)src + (uVar8 - 1);
            lVar12 = (long)src + (uVar8 - 9);
            puVar15 = (ulong *)local_58.ptr;
            do {
              lVar7 = 7;
              do {
                uVar9 = CTable[(ulong)*(byte *)(lVar6 + -7 + lVar7) + 1];
                local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
              uVar9 = CTable[(ulong)*(byte *)((uVar8 - 8) + (long)src) + 1];
              local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
              uVar16 = uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              *puVar15 = uVar16 >> ((ulong)(byte)-(char)local_58.bitPos[0] & 0x3f);
              lVar13 = 7;
              uVar9 = 0;
              lVar7 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar12 + -7 + lVar13) + 1];
                uVar9 = uVar9 >> (uVar1 & 0x3f) | uVar1;
                lVar7 = lVar7 + uVar1;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              uVar3 = (local_58.bitPos[0] & 0xff) >> 3;
              uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 0x10)) + 1];
              local_58.bitPos[1] = lVar7 + uVar1;
              local_58.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar9 >> (uVar1 & 0x3f);
              local_58.bitContainer[0] =
                   uVar16 >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
              uVar9 = local_58.bitPos[1] + ((uint)local_58.bitPos[0] & 7);
              local_58.ptr = (BYTE *)((long)puVar15 + ((uVar9 & 0xff) >> 3) + uVar3);
              local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
              *(size_t *)((long)puVar15 + uVar3) =
                   local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
              lVar6 = lVar6 + -0x10;
              lVar12 = lVar12 + -0x10;
              bVar2 = 0x10 < (long)uVar8;
              uVar8 = uVar8 - 0x10;
              puVar15 = (ulong *)local_58.ptr;
            } while (bVar2);
          }
          break;
        case 8:
          if (0 < (int)uVar5 % 7) {
            local_58.bitContainer[0] = 0;
            uVar8 = 0;
            pbVar14 = (byte *)((long)(int)uVar5 + (long)src);
            iVar11 = (int)uVar5 % 7 + 1;
            do {
              pbVar14 = pbVar14 + -1;
              uVar9 = CTable[(ulong)*pbVar14 + 1];
              uVar8 = uVar8 + uVar9;
              local_58.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              iVar11 = iVar11 + -1;
            } while (1 < iVar11);
            local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
            local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)dst);
          }
          uVar5 = (uint)srcSize;
          if (0x12492492 < (uVar5 * -0x49249249 + 0x12492492 >> 1 | uVar5 * -0x80000000)) {
            lVar6 = (long)(int)uVar5;
            lVar12 = 6;
            do {
              uVar8 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar6 + -7) + 1];
              local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar8;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar5 = uVar5 - 7;
            uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + -7) + 1];
            uVar9 = local_58.bitPos[0] + uVar8;
            local_58.bitContainer[0] =
                 uVar8 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar8 & 0x3f);
            local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f)
            ;
            local_58.ptr = (BYTE *)(((uVar9 & 0xff) >> 3) + (long)local_58.ptr);
          }
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
            lVar6 = (long)src + (uVar8 - 1);
            lVar12 = (long)src + (uVar8 - 8);
            puVar15 = (ulong *)local_58.ptr;
            do {
              lVar7 = 6;
              do {
                uVar9 = CTable[(ulong)*(byte *)(lVar6 + -6 + lVar7) + 1];
                local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
              uVar9 = CTable[(ulong)*(byte *)((uVar8 - 7) + (long)src) + 1];
              local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
              uVar16 = uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              *puVar15 = uVar16 >> ((ulong)(byte)-(char)local_58.bitPos[0] & 0x3f);
              lVar13 = 6;
              uVar9 = 0;
              lVar7 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar12 + -6 + lVar13) + 1];
                uVar9 = uVar9 >> (uVar1 & 0x3f) | uVar1;
                lVar7 = lVar7 + uVar1;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              uVar3 = (local_58.bitPos[0] & 0xff) >> 3;
              uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 0xe)) + 1];
              local_58.bitPos[1] = lVar7 + uVar1;
              local_58.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar9 >> (uVar1 & 0x3f);
              local_58.bitContainer[0] =
                   uVar16 >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
              uVar9 = local_58.bitPos[1] + ((uint)local_58.bitPos[0] & 7);
              local_58.ptr = (BYTE *)((long)puVar15 + ((uVar9 & 0xff) >> 3) + uVar3);
              local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
              *(size_t *)((long)puVar15 + uVar3) =
                   local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
              lVar6 = lVar6 + -0xe;
              lVar12 = lVar12 + -0xe;
              bVar2 = 0xe < (long)uVar8;
              uVar8 = uVar8 - 0xe;
              puVar15 = (ulong *)local_58.ptr;
            } while (bVar2);
          }
          break;
        case 9:
          if (0 < (int)uVar5 % 6) {
            local_58.bitContainer[0] = 0;
            uVar8 = 0;
            pbVar14 = (byte *)((long)(int)uVar5 + (long)src);
            iVar11 = (int)uVar5 % 6 + 1;
            do {
              pbVar14 = pbVar14 + -1;
              uVar9 = CTable[(ulong)*pbVar14 + 1];
              uVar8 = uVar8 + uVar9;
              local_58.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              iVar11 = iVar11 + -1;
            } while (1 < iVar11);
            local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
            local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)dst);
          }
          uVar5 = (uint)srcSize;
          if (0x15555554 < (uVar5 * -0x55555555 + 0x2aaaaaa8 >> 2 | uVar5 * -0x40000000)) {
            lVar6 = (long)(int)uVar5;
            lVar12 = 5;
            do {
              uVar8 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar6 + -6) + 1];
              local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar8;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar5 = uVar5 - 6;
            uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + -6) + 1];
            uVar9 = local_58.bitPos[0] + uVar8;
            local_58.bitContainer[0] =
                 uVar8 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar8 & 0x3f);
            local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f)
            ;
            local_58.ptr = (BYTE *)(((uVar9 & 0xff) >> 3) + (long)local_58.ptr);
          }
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
            lVar6 = (long)src + (uVar8 - 1);
            lVar12 = (long)src + (uVar8 - 7);
            puVar15 = (ulong *)local_58.ptr;
            do {
              lVar7 = 5;
              do {
                uVar9 = CTable[(ulong)*(byte *)(lVar6 + -5 + lVar7) + 1];
                local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
              uVar9 = CTable[(ulong)*(byte *)((uVar8 - 6) + (long)src) + 1];
              local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
              uVar16 = uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              *puVar15 = uVar16 >> ((ulong)(byte)-(char)local_58.bitPos[0] & 0x3f);
              lVar13 = 5;
              uVar9 = 0;
              lVar7 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar12 + -5 + lVar13) + 1];
                uVar9 = uVar9 >> (uVar1 & 0x3f) | uVar1;
                lVar7 = lVar7 + uVar1;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              uVar3 = (local_58.bitPos[0] & 0xff) >> 3;
              uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 0xc)) + 1];
              local_58.bitPos[1] = lVar7 + uVar1;
              local_58.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar9 >> (uVar1 & 0x3f);
              local_58.bitContainer[0] =
                   uVar16 >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
              uVar9 = local_58.bitPos[1] + ((uint)local_58.bitPos[0] & 7);
              local_58.ptr = (BYTE *)((long)puVar15 + ((uVar9 & 0xff) >> 3) + uVar3);
              local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
              *(size_t *)((long)puVar15 + uVar3) =
                   local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
              lVar6 = lVar6 + -0xc;
              lVar12 = lVar12 + -0xc;
              bVar2 = 0xc < (long)uVar8;
              uVar8 = uVar8 - 0xc;
              puVar15 = (ulong *)local_58.ptr;
            } while (bVar2);
          }
          break;
        case 10:
          if (0 < (int)uVar5 % 5) {
            local_58.bitContainer[0] = 0;
            uVar8 = 0;
            pbVar14 = (byte *)((long)(int)uVar5 + (long)src);
            iVar11 = (int)uVar5 % 5 + 1;
            do {
              pbVar14 = pbVar14 + -1;
              uVar9 = CTable[(ulong)*pbVar14 + 1];
              uVar8 = uVar8 + uVar9;
              local_58.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              iVar11 = iVar11 + -1;
            } while (1 < iVar11);
            local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
            local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)dst);
          }
          uVar5 = (uint)srcSize;
          if (0x19999998 < (uVar5 * -0x33333333 + 0x19999998 >> 1 | uVar5 * -0x80000000)) {
            lVar6 = (long)(int)uVar5;
            lVar12 = 4;
            do {
              uVar8 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar6 + -5) + 1];
              local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar8;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar5 = uVar5 - 5;
            uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + -5) + 1];
            local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
            uVar8 = local_58.bitPos[0] + uVar8;
            local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f)
            ;
            local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)local_58.ptr);
          }
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
            lVar6 = (long)src + (uVar8 - 1);
            lVar12 = (long)src + (uVar8 - 6);
            puVar15 = (ulong *)local_58.ptr;
            do {
              lVar7 = 4;
              do {
                uVar9 = CTable[(ulong)*(byte *)(lVar6 + -4 + lVar7) + 1];
                local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
              uVar9 = CTable[(ulong)*(byte *)((uVar8 - 5) + (long)src) + 1];
              uVar16 = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
              *puVar15 = uVar16 >> ((ulong)(byte)-(char)local_58.bitPos[0] & 0x3f);
              lVar13 = 4;
              uVar9 = 0;
              lVar7 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar12 + -4 + lVar13) + 1];
                uVar9 = uVar9 >> (uVar1 & 0x3f) | uVar1;
                lVar7 = lVar7 + uVar1;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              uVar1 = (local_58.bitPos[0] & 0xff) >> 3;
              local_58.bitPos[1] = CTable[(ulong)*(byte *)((long)src + (uVar8 - 10)) + 1];
              local_58.bitContainer[1] = uVar9 >> (local_58.bitPos[1] & 0x3f) | local_58.bitPos[1];
              local_58.bitPos[1] = lVar7 + local_58.bitPos[1];
              local_58.bitContainer[0] =
                   uVar16 >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
              uVar9 = local_58.bitPos[1] + ((uint)local_58.bitPos[0] & 7);
              local_58.ptr = (BYTE *)((long)puVar15 + ((uVar9 & 0xff) >> 3) + uVar1);
              local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
              *(size_t *)((long)puVar15 + uVar1) =
                   local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
              lVar6 = lVar6 + -10;
              lVar12 = lVar12 + -10;
              bVar2 = 10 < (long)uVar8;
              uVar8 = uVar8 - 10;
              puVar15 = (ulong *)local_58.ptr;
            } while (bVar2);
          }
          break;
        case 0xb:
          if (0 < (int)uVar5 % 5) {
            local_58.bitContainer[0] = 0;
            uVar8 = 0;
            pbVar14 = (byte *)((long)(int)uVar5 + (long)src);
            iVar11 = (int)uVar5 % 5 + 1;
            do {
              pbVar14 = pbVar14 + -1;
              uVar9 = CTable[(ulong)*pbVar14 + 1];
              uVar8 = uVar8 + uVar9;
              local_58.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              iVar11 = iVar11 + -1;
            } while (1 < iVar11);
            local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
            local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)dst);
          }
          uVar5 = (uint)srcSize;
          if (0x19999998 < (uVar5 * -0x33333333 + 0x19999998 >> 1 | uVar5 * -0x80000000)) {
            lVar6 = (long)(int)uVar5;
            lVar12 = 4;
            do {
              uVar8 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar6 + -5) + 1];
              local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar8;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar5 = uVar5 - 5;
            uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + -5) + 1];
            uVar9 = local_58.bitPos[0] + uVar8;
            local_58.bitContainer[0] =
                 uVar8 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar8 & 0x3f);
            local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f)
            ;
            local_58.ptr = (BYTE *)(((uVar9 & 0xff) >> 3) + (long)local_58.ptr);
          }
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
            lVar6 = (long)src + (uVar8 - 1);
            lVar12 = (long)src + (uVar8 - 6);
            puVar15 = (ulong *)local_58.ptr;
            do {
              lVar7 = 4;
              do {
                uVar9 = CTable[(ulong)*(byte *)(lVar6 + -4 + lVar7) + 1];
                local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
              uVar9 = CTable[(ulong)*(byte *)((uVar8 - 5) + (long)src) + 1];
              local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
              uVar16 = uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              *puVar15 = uVar16 >> ((ulong)(byte)-(char)local_58.bitPos[0] & 0x3f);
              lVar13 = 4;
              uVar9 = 0;
              lVar7 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar12 + -4 + lVar13) + 1];
                uVar9 = uVar9 >> (uVar1 & 0x3f) | uVar1;
                lVar7 = lVar7 + uVar1;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              uVar3 = (local_58.bitPos[0] & 0xff) >> 3;
              uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 10)) + 1];
              local_58.bitPos[1] = lVar7 + uVar1;
              local_58.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar9 >> (uVar1 & 0x3f);
              local_58.bitContainer[0] =
                   uVar16 >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
              uVar9 = local_58.bitPos[1] + ((uint)local_58.bitPos[0] & 7);
              local_58.ptr = (BYTE *)((long)puVar15 + ((uVar9 & 0xff) >> 3) + uVar3);
              local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
              *(size_t *)((long)puVar15 + uVar3) =
                   local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
              lVar6 = lVar6 + -10;
              lVar12 = lVar12 + -10;
              bVar2 = 10 < (long)uVar8;
              uVar8 = uVar8 - 10;
              puVar15 = (ulong *)local_58.ptr;
            } while (bVar2);
          }
          break;
        default:
          if (0 < (int)uVar5 % 9) {
            local_58.bitContainer[0] = 0;
            uVar8 = 0;
            pbVar14 = (byte *)((long)(int)uVar5 + (long)src);
            iVar11 = (int)uVar5 % 9 + 1;
            do {
              pbVar14 = pbVar14 + -1;
              uVar9 = CTable[(ulong)*pbVar14 + 1];
              uVar8 = uVar8 + uVar9;
              local_58.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              iVar11 = iVar11 + -1;
            } while (1 < iVar11);
            local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
            local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)dst);
          }
          uVar5 = (uint)srcSize;
          if (0xe38e38e < (uVar5 * 0x38e38e39 + 0xe38e38e >> 1 | uVar5 * -0x80000000)) {
            lVar6 = (long)(int)uVar5;
            lVar12 = 8;
            do {
              uVar8 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar6 + -9) + 1];
              local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar8;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar5 = uVar5 - 9;
            uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + -9) + 1];
            local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
            uVar8 = local_58.bitPos[0] + uVar8;
            local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f)
            ;
            local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)local_58.ptr);
          }
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
            lVar6 = (long)src + (uVar8 - 1);
            lVar12 = (long)src + (uVar8 - 10);
            puVar15 = (ulong *)local_58.ptr;
            do {
              lVar7 = 8;
              do {
                uVar9 = CTable[(ulong)*(byte *)(lVar6 + -8 + lVar7) + 1];
                local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
              uVar9 = CTable[(ulong)*(byte *)((uVar8 - 9) + (long)src) + 1];
              uVar16 = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
              *puVar15 = uVar16 >> ((ulong)(byte)-(char)local_58.bitPos[0] & 0x3f);
              lVar13 = 8;
              uVar9 = 0;
              lVar7 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar12 + -8 + lVar13) + 1];
                uVar9 = uVar9 >> (uVar1 & 0x3f) | uVar1;
                lVar7 = lVar7 + uVar1;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              uVar1 = (local_58.bitPos[0] & 0xff) >> 3;
              local_58.bitPos[1] = CTable[(ulong)*(byte *)((long)src + (uVar8 - 0x12)) + 1];
              local_58.bitContainer[1] = uVar9 >> (local_58.bitPos[1] & 0x3f) | local_58.bitPos[1];
              local_58.bitPos[1] = lVar7 + local_58.bitPos[1];
              local_58.bitContainer[0] =
                   uVar16 >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
              uVar9 = local_58.bitPos[1] + ((uint)local_58.bitPos[0] & 7);
              local_58.ptr = (BYTE *)((long)puVar15 + ((uVar9 & 0xff) >> 3) + uVar1);
              local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
              *(size_t *)((long)puVar15 + uVar1) =
                   local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
              lVar6 = lVar6 + -0x12;
              lVar12 = lVar12 + -0x12;
              bVar2 = 0x12 < (long)uVar8;
              uVar8 = uVar8 - 0x12;
              puVar15 = (ulong *)local_58.ptr;
            } while (bVar2);
          }
        }
      }
      else {
        uVar10 = uVar5 + 3;
        if (-1 < (int)uVar5) {
          uVar10 = uVar5;
        }
        iVar11 = uVar5 - (uVar10 & 0xfffffffc);
        local_58.ptr = (BYTE *)dst;
        if (0 < iVar11) {
          local_58.bitContainer[0] = 0;
          uVar8 = 0;
          pbVar14 = (byte *)((long)(int)uVar5 + (long)src);
          iVar11 = iVar11 + 1;
          do {
            pbVar14 = pbVar14 + -1;
            uVar9 = CTable[(ulong)*pbVar14 + 1];
            uVar8 = uVar8 + uVar9;
            local_58.bitContainer[0] =
                 uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar11 = iVar11 + -1;
          } while (1 < iVar11);
          local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
          *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
          local_58.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)dst);
          if (local_58.endPtr < local_58.ptr) {
            local_58.ptr = local_58.endPtr;
          }
        }
        uVar5 = (uint)srcSize;
        if ((srcSize & 7) != 0) {
          lVar6 = (long)(int)uVar5;
          lVar12 = 3;
          do {
            uVar8 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar6 + -4) + 1];
            local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
            local_58.bitPos[0] = local_58.bitPos[0] + uVar8;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          uVar5 = uVar5 - 4;
          uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + -4) + 1];
          uVar9 = local_58.bitPos[0] + uVar8;
          local_58.bitContainer[0] =
               uVar8 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar8 & 0x3f);
          local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
          *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
          local_58.ptr = (BYTE *)(((uVar9 & 0xff) >> 3) + (long)local_58.ptr);
          if (local_58.endPtr < local_58.ptr) {
            local_58.ptr = local_58.endPtr;
          }
        }
        if (0 < (int)uVar5) {
          uVar8 = (ulong)uVar5;
          lVar6 = (long)src + (uVar8 - 1);
          lVar12 = (long)src + (uVar8 - 5);
          do {
            lVar7 = 3;
            do {
              uVar9 = CTable[(ulong)*(byte *)(lVar6 + -3 + lVar7) + 1];
              local_58.bitContainer[0] = local_58.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
            uVar9 = CTable[(ulong)*(byte *)((uVar8 - 4) + (long)src) + 1];
            local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
            uVar9 = uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar9 & 0x3f);
            puVar15 = (ulong *)(((local_58.bitPos[0] & 0xff) >> 3) + (long)local_58.ptr);
            if (local_58.endPtr < puVar15) {
              puVar15 = (ulong *)local_58.endPtr;
            }
            *(ulong *)local_58.ptr = uVar9 >> ((ulong)(byte)-(char)local_58.bitPos[0] & 0x3f);
            lVar7 = 3;
            uVar16 = 0;
            lVar13 = 0;
            do {
              uVar1 = CTable[(ulong)*(byte *)(lVar12 + -3 + lVar7) + 1];
              uVar16 = uVar16 >> (uVar1 & 0x3f) | uVar1;
              lVar13 = lVar13 + uVar1;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
            uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 8)) + 1];
            local_58.bitPos[1] = lVar13 + uVar1;
            local_58.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar16 >> (uVar1 & 0x3f);
            local_58.bitContainer[0] =
                 uVar9 >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
            uVar9 = local_58.bitPos[1] + ((uint)local_58.bitPos[0] & 7);
            local_58.bitPos[0] = (size_t)((uint)uVar9 & 7);
            local_58.ptr = (BYTE *)(((uVar9 & 0xff) >> 3) + (long)puVar15);
            if (local_58.endPtr < local_58.ptr) {
              local_58.ptr = local_58.endPtr;
            }
            *puVar15 = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
            lVar6 = lVar6 + -8;
            lVar12 = lVar12 + -8;
            bVar2 = 8 < (long)uVar8;
            uVar8 = uVar8 - 8;
          } while (bVar2);
        }
      }
      local_58.startPtr = (BYTE *)dst;
      sVar4 = HUF_closeCStream(&local_58);
    }
    return sVar4;
  }
  return 0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = HUF_readCTableHeader(CTable).tableLog;
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { BYTE* op = ostart;
      size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}